

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

Entry * __thiscall
Ptex::v2_4::PtexReader::MetaData::newEntry
          (MetaData *this,uint8_t keysize,char *key,uint8_t datatype,uint32_t datasize,
          size_t *metaDataMemUsed)

{
  pointer *pppEVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>
  _Var3;
  uint32_t uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>_>,_bool>
  pVar6;
  Entry *e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_4::PtexReader::MetaData::Entry>
  local_c0;
  undefined8 uStack_68;
  undefined1 uStack_60;
  undefined7 local_5f;
  undefined1 uStack_58;
  undefined7 uStack_57;
  undefined1 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  uint uStack_34;
  
  uVar5 = CONCAT71(in_register_00000031,keysize) & 0xffffffff;
  local_e8 = &local_d8;
  local_c8 = metaDataMemUsed;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,key,key + uVar5);
  uStack_58 = 0;
  uStack_57 = 0;
  uStack_50 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_5f = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  paVar2 = &local_c0.first.field_2;
  if (local_e8 == &local_d8) {
    local_c0.first.field_2._8_8_ = local_d8._8_8_;
    local_c0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.first._M_dataplus._M_p = (pointer)local_e8;
  }
  local_c0.first.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
  local_c0.first.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
  local_c0.first._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c0.second.type = mdt_string;
  local_c0.second.datasize = 0;
  local_c0.second.data = (char *)0x0;
  local_c0.second.isLmd = false;
  local_c0.second.key = (char *)0x0;
  local_c0.second.lmdData = (LargeMetaData *)0x0;
  local_c0.second.lmdPos = 0;
  local_c0.second._48_8_ = (ulong)uStack_34 << 0x20;
  local_e8 = &local_d8;
  pVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>,std::_Select1st<std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>>>
          ::
          _M_emplace_unique<std::pair<std::__cxx11::string,Ptex::v2_4::PtexReader::MetaData::Entry>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>,std::_Select1st<std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Ptex::v2_4::PtexReader::MetaData::Entry>>>
                      *)&this->_map,&local_c0);
  _Var3 = pVar6.first._M_node;
  if (local_c0.second.isLmd == true) {
    local_c0.second.isLmd = false;
    if (local_c0.second.lmdData != (LargeMetaData *)0x0) {
      (*(local_c0.second.lmdData)->_vptr_LargeMetaData[1])();
      local_c0.second.lmdData = (LargeMetaData *)0x0;
    }
    local_c0.second.lmdPos = 0;
    local_c0.second._48_8_ = local_c0.second._48_8_ & 0xffffffff00000000;
  }
  else if (local_c0.second.data != (char *)0x0) {
    operator_delete__(local_c0.second.data);
  }
  local_c0.second.data = (char *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
  }
  local_c0.first._M_dataplus._M_p = (pointer)(_Var3._M_node + 2);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar4 = *(uint32_t *)((long)&_Var3._M_node[3]._M_left + 4);
    Entry::clear((Entry *)local_c0.first._M_dataplus._M_p);
  }
  else {
    __position._M_current =
         (this->_entries).
         super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (uint32_t)
            ((ulong)((long)__position._M_current -
                    (long)(this->_entries).
                          super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (__position._M_current ==
        (this->_entries).
        super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Ptex::v2_4::PtexReader::MetaData::Entry*,std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry*>>
      ::_M_realloc_insert<Ptex::v2_4::PtexReader::MetaData::Entry*const&>
                ((vector<Ptex::v2_4::PtexReader::MetaData::Entry*,std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry*>>
                  *)&this->_entries,__position,(Entry **)&local_c0);
    }
    else {
      *__position._M_current = (Entry *)local_c0.first._M_dataplus._M_p;
      pppEVar1 = &(this->_entries).
                  super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppEVar1 = *pppEVar1 + 1;
    }
  }
  *(undefined8 *)local_c0.first._M_dataplus._M_p = *(undefined8 *)(_Var3._M_node + 1);
  *(uint *)(local_c0.first._M_dataplus._M_p + 8) = (uint)datatype;
  *(uint32_t *)(local_c0.first._M_dataplus._M_p + 0xc) = datasize;
  *(uint32_t *)(local_c0.first._M_dataplus._M_p + 0x34) = uVar4;
  *local_c8 = *local_c8 + uVar5 + 0x59;
  return (Entry *)local_c0.first._M_dataplus._M_p;
}

Assistant:

Entry* newEntry(uint8_t keysize, const char* key, uint8_t datatype, uint32_t datasize, size_t& metaDataMemUsed)
	{
	    std::pair<MetaMap::iterator,bool> result =
		_map.insert(std::make_pair(std::string(key, keysize), Entry()));
	    Entry* e = &result.first->second;
	    bool newentry = result.second;
	    uint32_t index = 0;
	    if (newentry) {
		index = uint32_t(_entries.size());
		_entries.push_back(e);
	    }
	    else {
		index = e->index;
		e->clear();
	    }
	    e->key = result.first->first.c_str();
	    e->type = MetaDataType(datatype);
	    e->datasize = datasize;
	    e->index = index;
            metaDataMemUsed += sizeof(std::string) + keysize + 1 + sizeof(Entry);
            return e;
        }